

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

TraceLevel webrtc::anon_unknown_4::WebRtcSeverity(LoggingSeverity sev)

{
  TraceLevel TVar1;
  
  TVar1 = kTraceNone;
  if (sev < (LS_ERROR|LS_VERBOSE)) {
    TVar1 = *(TraceLevel *)(&DAT_001b0170 + (ulong)sev * 4);
  }
  return TVar1;
}

Assistant:

TraceLevel WebRtcSeverity(LoggingSeverity sev) {
  switch (sev) {
    // TODO(ajm): SENSITIVE doesn't have a corresponding webrtc level.
    case LS_SENSITIVE:  return kTraceInfo;
    case LS_VERBOSE:    return kTraceInfo;
    case LS_INFO:       return kTraceTerseInfo;
    case LS_WARNING:    return kTraceWarning;
    case LS_ERROR:      return kTraceError;
    default:            return kTraceNone;
  }
}